

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_heap.c
# Opt level: O0

void adt_heap_sortUp(adt_ary_t *heap,int32_t childIndex,adt_heap_family heapFamily)

{
  void *pvVar1;
  int s32Index;
  void **ppvVar2;
  void **ppvVar3;
  bool bVar4;
  void *tmp;
  int32_t parentIndex;
  adt_heap_elem_t *pParentElem;
  adt_heap_elem_t *pChildElem;
  void **ppParent;
  void **ppChild;
  _Bool swapItems;
  adt_heap_family heapFamily_local;
  int32_t childIndex_local;
  adt_ary_t *heap_local;
  
  if ((heap != (adt_ary_t *)0x0) && (0 < childIndex)) {
    s32Index = childIndex + -1 >> 1;
    ppvVar2 = adt_ary_get(heap,childIndex);
    ppvVar3 = adt_ary_get(heap,s32Index);
    if ((ppvVar2 == (void **)0x0) || (ppvVar3 == (void **)0x0)) {
      __assert_fail("(ppChild != 0) && (ppParent != 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_heap.c"
                    ,0x50,"void adt_heap_sortUp(adt_ary_t *, int32_t, adt_heap_family)");
    }
    if (heapFamily == ADT_MIN_HEAP) {
      bVar4 = *(uint *)((long)*ppvVar2 + 8) < *(uint *)((long)*ppvVar3 + 8);
    }
    else {
      bVar4 = *(uint *)((long)*ppvVar3 + 8) < *(uint *)((long)*ppvVar2 + 8);
    }
    if (bVar4) {
      pvVar1 = *ppvVar2;
      *ppvVar2 = *ppvVar3;
      *ppvVar3 = pvVar1;
      if (0 < s32Index) {
        adt_heap_sortUp(heap,s32Index,heapFamily);
      }
    }
  }
  return;
}

Assistant:

void adt_heap_sortUp(adt_ary_t *heap, int32_t childIndex, adt_heap_family heapFamily){
   if ( (heap != 0) && (childIndex>0) ){
      bool swapItems = false;
      void **ppChild, **ppParent;
      adt_heap_elem_t *pChildElem, *pParentElem;
      //parent index is at floor((childIndex-1)/2)
      int32_t parentIndex = (childIndex-1)>>1;

      ppChild = adt_ary_get(heap, childIndex);
      ppParent = adt_ary_get(heap, parentIndex);
      assert ( (ppChild != 0) && (ppParent != 0) );
      pChildElem = *ppChild;
      pParentElem = *ppParent;
      if (heapFamily == ADT_MIN_HEAP){
         if (pChildElem->u32Value < pParentElem->u32Value){
            swapItems = true;
         }
      }
      else {
         //implicit ADT_MAX_HEAP
         if (pChildElem->u32Value > pParentElem->u32Value){
            swapItems = true;
         }
      }
      if (swapItems == true){
         //swap parent and child
         void *tmp;
         tmp = *ppChild;
         *ppChild = *ppParent;
         *ppParent = tmp;

         //call recursively on parent (bubble up)
         if (parentIndex > 0) {
            adt_heap_sortUp(heap, parentIndex, heapFamily);
         }
      }
   }
}